

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O0

ON_SubDFromSurfaceParameters *
Internal_InitSubDFromSurfaceParameters
          (ON_SubDFromSurfaceParameters *__return_storage_ptr__,Methods method,bool bCorners)

{
  bool bCorners_local;
  Methods method_local;
  
  ON_SubDFromSurfaceParameters::ON_SubDFromSurfaceParameters(__return_storage_ptr__);
  if (method != Unset) {
    ON_SubDFromSurfaceParameters::SetMethod(__return_storage_ptr__,method);
  }
  ON_SubDFromSurfaceParameters::SetCorners(__return_storage_ptr__,bCorners);
  return __return_storage_ptr__;
}

Assistant:

static const ON_SubDFromSurfaceParameters Internal_InitSubDFromSurfaceParameters(
  ON_SubDFromSurfaceParameters::Methods method,
  bool bCorners
  )
{
  ON_SubDFromSurfaceParameters p;
  if (ON_SubDFromSurfaceParameters::Methods::Unset != method)
    p.SetMethod(method);
  p.SetCorners(bCorners);
  return p;
}